

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.h
# Opt level: O3

void __thiscall merlin::detail::node::clear(node *this)

{
  pointer puVar1;
  pointer ppnVar2;
  factor *rhs;
  factor local_70;
  
  puVar1 = (this->clique).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->clique).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->clique).m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar1 = (this->clique).m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->clique).m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->clique).m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  (this->clique).m_d = (vsize *)0x0;
  factor::factor(&local_70,1.0);
  rhs = factor::operator=(&this->belief,&local_70);
  factor::operator=(&this->theta,rhs);
  factor::~factor(&local_70);
  this->parent = (node *)0x0;
  ppnVar2 = (this->children).
            super__Vector_base<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->children).
      super__Vector_base<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppnVar2) {
    (this->children).
    super__Vector_base<merlin::detail::node_*,_std::allocator<merlin::detail::node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppnVar2;
  }
  this->weight = 0.0;
  return;
}

Assistant:

void clear() {
			clique.clear();
			theta = belief = factor(1.0);
			parent = NULL; children.clear();
			weight = 0.0;
		}